

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_echo.c
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  uint uVar4;
  in_addr_t iVar5;
  int __fd;
  int iVar6;
  LIBSSH2_SESSION *session;
  long lVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  undefined1 *puVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  size_t sStackY_7da0;
  libssh2_knownhost **pplVar15;
  ulong local_7d80;
  uint local_7d78;
  uint local_7d74;
  size_t len;
  char *exitsignal;
  int type;
  sockaddr_in sin;
  libssh2_knownhost *host;
  
  exitsignal = "none";
  if (((1 < argc) && (hostname = argv[1], argc != 2)) && (username = argv[2], 3 < (uint)argc)) {
    password = argv[3];
  }
  uVar4 = libssh2_init(0);
  if (uVar4 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar4);
    return 1;
  }
  iVar5 = inet_addr(hostname);
  iVar6 = 0;
  __fd = socket(2,1,0);
  if (__fd == -1) {
    fwrite("failed to create socket.\n",0x19,1,_stderr);
    goto LAB_00102a16;
  }
  sin.sin_family = 2;
  sin.sin_port = 0x1600;
  sin.sin_addr.s_addr = iVar5;
  iVar6 = connect(__fd,(sockaddr *)&sin,0x10);
  if (iVar6 == 0) {
    iVar6 = 0;
    session = (LIBSSH2_SESSION *)libssh2_session_init_ex(0,0,0,0);
    if (session == (LIBSSH2_SESSION *)0x0) {
      fwrite("Could not initialize SSH session.\n",0x22,1,_stderr);
    }
    else {
      libssh2_session_set_blocking(session,0);
      do {
        uVar4 = libssh2_session_handshake(session,__fd);
      } while (uVar4 == 0xffffffdb);
      if (uVar4 == 0) {
        lVar7 = libssh2_knownhost_init(session);
        if (lVar7 == 0) {
          return 2;
        }
        bVar2 = true;
        libssh2_knownhost_readfile(lVar7,"known_hosts",1);
        libssh2_knownhost_writefile(lVar7,"dumpfile",1);
        lVar8 = libssh2_session_hostkey(session,&len,&type);
        if (lVar8 == 0) {
          return 3;
        }
        pplVar15 = &host;
        uVar4 = libssh2_knownhost_checkp(lVar7,hostname,0x16,lVar8,len,0x10001,pplVar15);
        if ((int)uVar4 < 2) {
          pcVar14 = host->key;
        }
        else {
          pcVar14 = "<none>";
        }
        fprintf(_stderr,"Host check: %d, key: %s\n",(ulong)uVar4,pcVar14);
        libssh2_knownhost_free(lVar7);
        if (*password == '\0') {
LAB_00102642:
          libssh2_trace(session,0x200);
          while( true ) {
            pplVar15 = (libssh2_knownhost **)((ulong)pplVar15 & 0xffffffff00000000);
            lVar7 = libssh2_channel_open_ex(session,"session",7,0x200000,0x8000,0,pplVar15);
            if (lVar7 != 0) break;
            iVar6 = libssh2_session_last_error(session,0,0,0);
            if (iVar6 != -0x25) {
              pcVar14 = "Error\n";
              sStackY_7da0 = 6;
              goto LAB_00102ac0;
            }
            waitsocket(__fd,session);
          }
          while (iVar6 = libssh2_channel_process_startup(lVar7,"exec",4,"cat",3), iVar6 == -0x25) {
            waitsocket(__fd,session);
          }
          if (iVar6 == 0) {
            for (lVar8 = 0; lVar8 != 32000; lVar8 = lVar8 + 1) {
              *(undefined1 *)((long)&host + lVar8) = 0x41;
            }
            puVar11 = (undefined1 *)malloc(0x20);
            if (puVar11 != (undefined1 *)0x0) {
              *puVar11 = 2;
              *(long *)(puVar11 + 8) = lVar7;
              *(undefined8 *)(puVar11 + 0x10) = 5;
              local_7d80 = 0;
              uVar13 = 0;
              local_7d74 = 0;
              local_7d78 = 0;
              do {
                do {
                  iVar6 = libssh2_poll(puVar11,1,10);
                } while (iVar6 < 1);
                bVar1 = false;
                if ((puVar11[0x18] & 1) != 0) {
                  lVar8 = libssh2_channel_read_ex(lVar7,0,&host,32000);
                  if (lVar8 == -0x25) {
                    local_7d74 = local_7d74 + 1;
                    fwrite("will read again\n",0x10,1,_stderr);
                    bVar1 = bVar2;
                  }
                  else {
                    if (lVar8 < 0) {
                      pcVar14 = "read failed\n";
                      sStackY_7da0 = 0xc;
                      goto LAB_00102ac0;
                    }
                    uVar13 = uVar13 + lVar8;
                    fprintf(_stderr,"read %ld bytes (%lu in total)\n",lVar8,uVar13);
                    bVar1 = bVar2;
                  }
                }
                if ((puVar11[0x18] & 4) != 0) {
                  if (local_7d80 < 1500000) {
                    uVar12 = 1500000 - local_7d80;
                    if (31999 < uVar12) {
                      uVar12 = 32000;
                    }
                    lVar8 = libssh2_channel_write_ex(lVar7,0,&host,uVar12);
                    if (lVar8 == -0x25) {
                      local_7d78 = local_7d78 + 1;
                      pcVar14 = "will write again\n";
                      sStackY_7da0 = 0x11;
LAB_00102850:
                      fwrite(pcVar14,sStackY_7da0,1,_stderr);
                      bVar1 = bVar2;
                    }
                    else {
                      if (lVar8 < 0) {
                        pcVar14 = "write failed\n";
                        sStackY_7da0 = 0xd;
                        goto LAB_00102ac0;
                      }
                      fprintf(_stderr,"wrote %ld bytes (%lu in total)",lVar8);
                      if (lVar8 != 32000 && local_7d80 < 0x166661) {
                        fwrite(" PARTIAL",8,1,_stderr);
                      }
                      fputc(10,_stderr);
                      local_7d80 = local_7d80 + lVar8;
                      bVar1 = bVar2;
                    }
                  }
                  else {
                    iVar6 = libssh2_channel_send_eof(lVar7);
                    if (iVar6 == -0x25) {
                      pcVar14 = "will send eof again\n";
                      sStackY_7da0 = 0x14;
                      goto LAB_00102850;
                    }
                    if (iVar6 < 0) {
                      pcVar14 = "send eof failed\n";
                      sStackY_7da0 = 0x10;
                      goto LAB_00102ac0;
                    }
                    fwrite("sent eof\n",9,1,_stderr);
                    puVar11[0x10] = puVar11[0x10] & 0xfb;
                    bVar1 = bVar2;
                  }
                }
              } while ((bVar1) || ((*(ulong *)(puVar11 + 0x18) & 0x80) == 0));
              pcVar14 = "none";
              while (iVar6 = libssh2_channel_close(lVar7), iVar6 == -0x25) {
                waitsocket(__fd,session);
              }
              if (iVar6 == 0) {
                iVar6 = libssh2_channel_get_exit_status(lVar7);
                libssh2_channel_get_exit_signal(lVar7,&exitsignal,0,0,0,0,0);
                pcVar14 = exitsignal;
                if (exitsignal != (char *)0x0) goto LAB_00102997;
              }
              else {
                iVar6 = 0x7f;
LAB_00102997:
                fprintf(_stderr,"\nGot signal: %s\n",pcVar14);
              }
              libssh2_channel_free(lVar7);
              fprintf(_stderr,"\nrereads: %d rewrites: %d totwritten %lu\n",(ulong)local_7d74,
                      (ulong)local_7d78,local_7d80);
              if (local_7d80 != uVar13) {
                fprintf(_stderr,"\n*** FAIL bytes written: %lu bytes read: %lu ***\n",local_7d80);
                goto LAB_00102ac9;
              }
              goto LAB_001029e4;
            }
            pcVar14 = "malloc failed\n";
            sStackY_7da0 = 0xe;
          }
          else {
            pcVar14 = "exec error\n";
            sStackY_7da0 = 0xb;
          }
        }
        else {
          do {
            pcVar14 = username;
            sVar9 = strlen(username);
            pcVar3 = password;
            sVar10 = strlen(password);
            iVar6 = libssh2_userauth_password_ex
                              (session,pcVar14,sVar9 & 0xffffffff,pcVar3,sVar10 & 0xffffffff,0);
          } while (iVar6 == -0x25);
          if (iVar6 == 0) goto LAB_00102642;
          pcVar14 = "Authentication by password failed.\n";
          sStackY_7da0 = 0x23;
        }
LAB_00102ac0:
        fwrite(pcVar14,sStackY_7da0,1,_stderr);
LAB_00102ac9:
        exit(1);
      }
      iVar6 = 0;
      fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar4);
LAB_001029e4:
      libssh2_session_disconnect_ex(session,0xb,"Normal Shutdown","");
      libssh2_session_free(session);
    }
  }
  else {
    fwrite("failed to connect.\n",0x13,1,_stderr);
    iVar6 = 0;
  }
  shutdown(__fd,2);
  close(__fd);
LAB_00102a16:
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return iVar6;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    int exitcode = 0;
    char *exitsignal = (char *)"none";
    size_t len;
    LIBSSH2_KNOWNHOSTS *nh;
    int type;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostname = argv[1];  /* must be ip address only */
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    hostaddr = inet_addr(hostname);

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* tell libssh2 we want it all done non-blocking */
    libssh2_session_set_blocking(session, 0);

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    while((rc = libssh2_session_handshake(session, sock)) ==
          LIBSSH2_ERROR_EAGAIN);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    nh = libssh2_knownhost_init(session);
    if(!nh) {
        /* eeek, do cleanup here */
        return 2;
    }

    /* read all hosts from here */
    libssh2_knownhost_readfile(nh, "known_hosts",
                               LIBSSH2_KNOWNHOST_FILE_OPENSSH);

    /* store all known hosts to here */
    libssh2_knownhost_writefile(nh, "dumpfile",
                                LIBSSH2_KNOWNHOST_FILE_OPENSSH);

    fingerprint = libssh2_session_hostkey(session, &len, &type);
    if(fingerprint) {
        struct libssh2_knownhost *host;
        int check = libssh2_knownhost_checkp(nh, hostname, 22,
                                             fingerprint, len,
                                             LIBSSH2_KNOWNHOST_TYPE_PLAIN|
                                             LIBSSH2_KNOWNHOST_KEYENC_RAW,
                                             &host);

        fprintf(stderr, "Host check: %d, key: %s\n", check,
                (check <= LIBSSH2_KNOWNHOST_CHECK_MISMATCH) ?
                host->key : "<none>");

        /*****
         * At this point, we could verify that 'check' tells us the key is
         * fine or bail out.
         *****/
    }
    else {
        /* eeek, do cleanup here */
        return 3;
    }
    libssh2_knownhost_free(nh);

    if(strlen(password) != 0) {
        /* We could authenticate via password */
        while((rc = libssh2_userauth_password(session, username, password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by password failed.\n");
            exit(1);
        }
    }

    libssh2_trace(session, LIBSSH2_TRACE_SOCKET);

    /* Exec non-blocking on the remote host */
    do {
        channel = libssh2_channel_open_session(session);
        if(channel ||
           libssh2_session_last_error(session, NULL, NULL, 0) !=
           LIBSSH2_ERROR_EAGAIN)
            break;
        waitsocket(sock, session);
    } while(1);
    if(!channel) {
        fprintf(stderr, "Error\n");
        exit(1);
    }
    while((rc = libssh2_channel_exec(channel, commandline)) ==
          LIBSSH2_ERROR_EAGAIN) {
        waitsocket(sock, session);
    }
    if(rc) {
        fprintf(stderr, "exec error\n");
        exit(1);
    }
    else {
        LIBSSH2_POLLFD *fds = NULL;
        int running = 1;
        size_t bufsize = BUFSIZE;
        char buffer[BUFSIZE];
        size_t totsize = 1500000;
        size_t totwritten = 0;
        size_t totread = 0;
        int rereads = 0;
        int rewrites = 0;
        int i;

        for(i = 0; i < BUFSIZE; i++)
            buffer[i] = 'A';

        fds = malloc(sizeof(LIBSSH2_POLLFD));
        if(!fds) {
            fprintf(stderr, "malloc failed\n");
            exit(1);
        }

        fds[0].type = LIBSSH2_POLLFD_CHANNEL;
        fds[0].fd.channel = channel;
        fds[0].events = LIBSSH2_POLLFD_POLLIN | LIBSSH2_POLLFD_POLLOUT;

        do {
            int act = 0;
            rc = libssh2_poll(fds, 1, 10);

            if(rc < 1)
                continue;

            if(fds[0].revents & LIBSSH2_POLLFD_POLLIN) {
                ssize_t n = libssh2_channel_read(channel,
                                                 buffer, sizeof(buffer));
                act++;

                if(n == LIBSSH2_ERROR_EAGAIN) {
                    rereads++;
                    fprintf(stderr, "will read again\n");
                }
                else if(n < 0) {
                    fprintf(stderr, "read failed\n");
                    exit(1);
                }
                else {
                    totread += (size_t)n;
                    fprintf(stderr, "read %ld bytes (%lu in total)\n",
                            (long)n, (unsigned long)totread);
                }
            }

            if(fds[0].revents & LIBSSH2_POLLFD_POLLOUT) {
                act++;

                if(totwritten < totsize) {
                    /* we have not written all data yet */
                    size_t left = totsize - totwritten;
                    size_t size = (left < bufsize) ? left : bufsize;
                    ssize_t n = libssh2_channel_write_ex(channel, 0,
                                                         buffer, size);

                    if(n == LIBSSH2_ERROR_EAGAIN) {
                        rewrites++;
                        fprintf(stderr, "will write again\n");
                    }
                    else if(n < 0) {
                        fprintf(stderr, "write failed\n");
                        exit(1);
                    }
                    else {
                        totwritten += (size_t)n;
                        fprintf(stderr, "wrote %ld bytes (%lu in total)",
                                (long)n, (unsigned long)totwritten);
                        if(left >= bufsize && (size_t)n != bufsize) {
                            fprintf(stderr, " PARTIAL");
                        }
                        fprintf(stderr, "\n");
                    }
                }
                else {
                    /* all data written, send EOF */
                    rc = libssh2_channel_send_eof(channel);

                    if(rc == LIBSSH2_ERROR_EAGAIN) {
                        fprintf(stderr, "will send eof again\n");
                    }
                    else if(rc < 0) {
                        fprintf(stderr, "send eof failed\n");
                        exit(1);
                    }
                    else {
                        fprintf(stderr, "sent eof\n");
                        /* we're done writing, stop listening for OUT events */
                        fds[0].events &=
                            ~(unsigned long)LIBSSH2_POLLFD_POLLOUT;
                    }
                }
            }

            if(fds[0].revents & LIBSSH2_POLLFD_CHANNEL_CLOSED) {
                if(!act) /* don't leave loop until we have read all data */
                    running = 0;
            }
        } while(running);

        exitcode = 127;
        while((rc = libssh2_channel_close(channel)) == LIBSSH2_ERROR_EAGAIN)
            waitsocket(sock, session);

        if(rc == 0) {
            exitcode = libssh2_channel_get_exit_status(channel);
            libssh2_channel_get_exit_signal(channel, &exitsignal,
                                            NULL, NULL, NULL, NULL, NULL);
        }

        if(exitsignal)
            fprintf(stderr, "\nGot signal: %s\n", exitsignal);

        libssh2_channel_free(channel);
        channel = NULL;

        fprintf(stderr, "\nrereads: %d rewrites: %d totwritten %lu\n",
                rereads, rewrites, (unsigned long)totwritten);

        if(totwritten != totread) {
            fprintf(stderr, "\n*** FAIL bytes written: "
                    "%lu bytes read: %lu ***\n",
                    (unsigned long)totwritten, (unsigned long)totread);
            exit(1);
        }
    }

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return exitcode;
}